

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O3

void Vec_QuePush(Vec_Que_t *p,int v)

{
  size_t sVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  ulong uVar11;
  
  iVar8 = p->nCap;
  if (iVar8 <= p->nSize) {
    iVar4 = p->nSize + 1;
    iVar8 = iVar8 * 2;
    if (iVar8 < iVar4) {
      iVar8 = iVar4;
    }
    lVar14 = (long)iVar8;
    sVar1 = lVar14 * 4;
    if (p->pHeap == (int *)0x0) {
      piVar6 = (int *)malloc(sVar1);
    }
    else {
      piVar6 = (int *)realloc(p->pHeap,sVar1);
    }
    p->pHeap = piVar6;
    if (p->pOrder == (int *)0x0) {
      piVar7 = (int *)malloc(sVar1);
    }
    else {
      piVar7 = (int *)realloc(p->pOrder,sVar1);
      piVar6 = p->pHeap;
    }
    p->pOrder = piVar7;
    memset(piVar6 + p->nCap,0xff,(lVar14 - p->nCap) * 4);
    memset(p->pOrder + p->nCap,0xff,(lVar14 - p->nCap) * 4);
    p->nCap = iVar8;
  }
  if (iVar8 <= v) {
    iVar5 = v + 1;
    iVar3 = iVar8 * 2;
    iVar4 = iVar8 * -2;
    iVar8 = iVar3;
    if (iVar5 != iVar3 && SBORROW4(iVar5,iVar3) == iVar5 + iVar4 < 0) {
      iVar8 = iVar5;
    }
    lVar14 = (long)iVar8;
    sVar1 = lVar14 * 4;
    if (p->pHeap == (int *)0x0) {
      piVar6 = (int *)malloc(sVar1);
    }
    else {
      piVar6 = (int *)realloc(p->pHeap,sVar1);
    }
    p->pHeap = piVar6;
    if (p->pOrder == (int *)0x0) {
      piVar7 = (int *)malloc(sVar1);
    }
    else {
      piVar7 = (int *)realloc(p->pOrder,sVar1);
      piVar6 = p->pHeap;
    }
    p->pOrder = piVar7;
    memset(piVar6 + p->nCap,0xff,(lVar14 - p->nCap) * 4);
    memset(p->pOrder + p->nCap,0xff,(lVar14 - p->nCap) * 4);
    p->nCap = iVar8;
  }
  iVar4 = p->nSize;
  if (iVar8 <= iVar4) {
    __assert_fail("p->nSize < p->nCap",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar6 = p->pOrder;
  if (piVar6[v] != -1) {
    __assert_fail("p->pOrder[v] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar7 = p->pHeap;
  if (piVar7[iVar4] != -1) {
    __assert_fail("p->pHeap[p->nSize] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar6[v] = iVar4;
  iVar8 = p->nSize;
  p->nSize = iVar8 + 1;
  piVar7[iVar8] = v;
  pfVar2 = *p->pCostsFlt;
  if (pfVar2 == (float *)0x0) {
    fVar15 = (float)v;
  }
  else {
    fVar15 = pfVar2[v];
  }
  uVar13 = piVar6[v];
  uVar10 = (ulong)(int)uVar13;
  if (uVar10 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (piVar7[uVar10] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (1 < (int)uVar13) {
    uVar12 = (ulong)uVar13;
    uVar11 = uVar10;
    do {
      uVar9 = (uint)uVar11;
      uVar12 = uVar12 >> 1;
      iVar8 = piVar7[uVar12];
      if (pfVar2 == (float *)0x0) {
        fVar16 = (float)iVar8;
      }
      else {
        fVar16 = pfVar2[iVar8];
      }
      uVar10 = uVar11 & 0xffffffff;
      uVar13 = uVar9;
      if (fVar15 <= fVar16) break;
      piVar7[uVar11 & 0xffffffff] = iVar8;
      piVar6[iVar8] = uVar9;
      uVar13 = (uint)uVar12;
      uVar11 = uVar12;
      uVar10 = uVar12;
    } while (3 < uVar9);
  }
  piVar7[uVar10] = v;
  piVar6[v] = uVar13;
  return;
}

Assistant:

static inline void Vec_QuePush( Vec_Que_t * p, int v )
{
    if ( p->nSize >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(p->nSize+1, 2*p->nCap) );
    if ( v >= p->nCap )
        Vec_QueGrow( p, Abc_MaxInt(v+1, 2*p->nCap) );
    assert( p->nSize < p->nCap );
    assert( p->pOrder[v] == -1 );
    assert( p->pHeap[p->nSize] == -1 );
    p->pOrder[v] = p->nSize;
    p->pHeap[p->nSize++] = v;
    Vec_QueMoveUp( p, v );
}